

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O3

UINT8 AudioDrv_DataForward_Remove(void *drvStruct,void *destDrvStruct)

{
  long *plVar1;
  UINT8 UVar2;
  long *__ptr;
  
  if (destDrvStruct == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
    __ptr = *(long **)((long)drvStruct + 0x38);
    UVar2 = 0xff;
    if (__ptr != (long *)0x0) {
      plVar1 = (long *)((long)drvStruct + 0x38);
      if ((void *)*__ptr != destDrvStruct) {
        do {
          plVar1 = __ptr;
          __ptr = (long *)plVar1[1];
          if (__ptr == (long *)0x0) goto LAB_00110a86;
        } while ((void *)*__ptr != destDrvStruct);
        plVar1 = plVar1 + 1;
      }
      *plVar1 = __ptr[1];
      free(__ptr);
      if ((*(long *)((long)drvStruct + 0x38) == 0) && (*(long *)((long)drvStruct + 8) != 0)) {
        (**(code **)(*(long *)((long)drvStruct + 8) + 0x68))
                  (*(undefined8 *)((long)drvStruct + 0x20),*(undefined8 *)((long)drvStruct + 0x30),
                   *(undefined8 *)((long)drvStruct + 0x28));
      }
      UVar2 = '\0';
    }
LAB_00110a86:
    OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  }
  return UVar2;
}

Assistant:

UINT8 AudioDrv_DataForward_Remove(void* drvStruct, const void* destDrvStruct)
{
	ADRV_INSTANCE* audInstSrc = (ADRV_INSTANCE*)drvStruct;
	ADRV_INSTANCE* audInstDst = (ADRV_INSTANCE*)destDrvStruct;
	UINT8 retVal;
	
	if (audInstDst == NULL)
		return 0xFF;
	OSMutex_Lock(audInstSrc->hMutex);
	retVal = ADrvLst_Remove(&audInstSrc->forwardDrvs, audInstDst);
	if (retVal)
	{
		OSMutex_Unlock(audInstSrc->hMutex);
		return retVal;
	}
	
	// make it call the original callback function
	if (audInstSrc->forwardDrvs == NULL && audInstSrc->drvStruct != NULL)
		audInstSrc->drvStruct->SetCallback(audInstSrc->drvData, audInstSrc->mainCallback, audInstSrc->userParam);
	OSMutex_Unlock(audInstSrc->hMutex);
	return AERR_OK;
}